

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.h
# Opt level: O0

void __thiscall
xemmai::t_engine::f_epoch_increment
          (t_engine *this,t_object ***a_p0,t_object ***a_p1,t_object **a_q1,t_object ***a_decrements
          )

{
  t_object **pptVar1;
  t_object *ptVar2;
  t_object *ptVar3;
  t_object *q;
  t_object *p;
  t_object ***a_decrements_local;
  t_object **a_q1_local;
  t_object ***a_p1_local;
  t_object ***a_p0_local;
  t_engine *this_local;
  
  while (*a_p1 < a_q1) {
    pptVar1 = *a_p0;
    *a_p0 = pptVar1 + 1;
    ptVar3 = *pptVar1;
    ptVar2 = **a_p1;
    if ((ptVar3 != ptVar2) && (ptVar3 = f_object__find(this,ptVar3), ptVar3 != ptVar2)) {
      if (ptVar3 != (t_object *)0x0) {
        t_object::f_increment(ptVar3);
      }
      if (ptVar2 != (t_object *)0x0) {
        pptVar1 = *a_decrements;
        *a_decrements = pptVar1 + 1;
        *pptVar1 = ptVar2;
      }
      **a_p1 = ptVar3;
    }
    *a_p1 = *a_p1 + 1;
  }
  return;
}

Assistant:

void f_epoch_increment(t_object**& a_p0, t_object**& a_p1, t_object** a_q1, t_object**& a_decrements)
	{
		for (; a_p1 < a_q1; ++a_p1) {
			auto p = *a_p0++;
			auto q = *a_p1;
			if (p == q) continue;
			p = f_object__find(p);
			if (p == q) continue;
			if (p) p->f_increment();
			if (q) *a_decrements++ = q;
			*a_p1 = p;
		}
	}